

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HighsInt iRow,HighsInt *hint)

{
  pointer piVar1;
  pointer pdVar2;
  iterator iVar3;
  iterator iVar4;
  HVector *pHVar5;
  int iVar6;
  double *__args;
  long lVar7;
  double value;
  HighsInt index;
  int local_5c;
  double local_58;
  HVector *local_50;
  int local_44;
  HighsInt *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  iVar6 = aq->packCount;
  local_5c = iRow;
  local_50 = aq;
  local_40 = hint;
  if (0 < (long)iVar6) {
    piVar1 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (vector<int,std::allocator<int>> *)&this->pf_index;
    lVar7 = 0;
    do {
      local_44 = piVar1[lVar7];
      local_58 = pdVar2[lVar7];
      if (local_44 != local_5c) {
        iVar3._M_current =
             (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_38,iVar3,&local_44);
        }
        else {
          *iVar3._M_current = local_44;
          (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar4._M_current =
             (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->pf_value,iVar4,&local_58);
        }
        else {
          *iVar4._M_current = local_58;
          (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
  }
  iVar3._M_current =
       (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->pf_pivot_index,iVar3,&local_5c);
  }
  else {
    *iVar3._M_current = local_5c;
    (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pHVar5 = local_50;
  __args = (local_50->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + local_5c;
  iVar4._M_current =
       (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->pf_pivot_value,iVar4,__args);
  }
  else {
    *iVar4._M_current = *__args;
    (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  iVar6 = (int)((ulong)((long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_58 = (double)CONCAT44(local_58._4_4_,iVar6);
  iVar3._M_current =
       (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->pf_start,iVar3,(int *)&local_58);
  }
  else {
    *iVar3._M_current = iVar6;
    (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  iVar6 = this->u_total_x + pHVar5->packCount;
  this->u_total_x = iVar6;
  if (this->u_merit_x < iVar6) {
    *local_40 = 1;
  }
  return;
}

Assistant:

void HFactor::updatePF(HVector* aq, HighsInt iRow, HighsInt* hint) {
  // Check space
  const HighsInt column_count = aq->packCount;
  const HighsInt* variable_index = aq->packIndex.data();
  const double* columnArray = aq->packValue.data();

  // Copy the pivotal column
  for (HighsInt i = 0; i < column_count; i++) {
    HighsInt index = variable_index[i];
    double value = columnArray[i];
    if (index != iRow) {
      pf_index.push_back(index);
      pf_value.push_back(value);
    }
  }

  // Save pivot
  pf_pivot_index.push_back(iRow);
  pf_pivot_value.push_back(aq->array[iRow]);
  pf_start.push_back(pf_index.size());

  // Check refactor
  u_total_x += aq->packCount;
  if (u_total_x > u_merit_x) *hint = 1;
}